

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.hh
# Opt level: O0

Roaring * roaring::Roaring::fastunion(size_t n,Roaring **inputs)

{
  void *pvVar1;
  runtime_error *prVar2;
  roaring_bitmap_t *prVar3;
  long in_RDX;
  ulong in_RSI;
  Roaring *in_RDI;
  roaring_bitmap_t *c_ans;
  size_t k;
  roaring_bitmap_t **x;
  Roaring *ans;
  roaring_bitmap_t *in_stack_ffffffffffffff98;
  Roaring *in_stack_ffffffffffffffa0;
  Roaring *number;
  ulong local_38;
  
  number = in_RDI;
  pvVar1 = roaring_malloc(0x113b4e);
  if (pvVar1 == (void *)0x0) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"failed memory alloc in fastunion");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  for (local_38 = 0; local_38 < in_RSI; local_38 = local_38 + 1) {
    *(undefined8 *)((long)pvVar1 + local_38 * 8) = *(undefined8 *)(in_RDX + local_38 * 8);
  }
  prVar3 = roaring_bitmap_or_many((size_t)number,(roaring_bitmap_t **)in_stack_ffffffffffffffa0);
  if (prVar3 != (roaring_bitmap_t *)0x0) {
    Roaring(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    roaring_free((void *)0x113c8a);
    return in_RDI;
  }
  roaring_free((void *)0x113c1a);
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar2,"failed memory alloc in fastunion");
  __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static Roaring fastunion(size_t n, const Roaring **inputs) {
        const roaring_bitmap_t **x = (const roaring_bitmap_t **)roaring_malloc(
            n * sizeof(roaring_bitmap_t *));
        if (x == NULL) {
            ROARING_TERMINATE("failed memory alloc in fastunion");
        }
        for (size_t k = 0; k < n; ++k) x[k] = &inputs[k]->roaring;

        roaring_bitmap_t *c_ans = api::roaring_bitmap_or_many(n, x);
        if (c_ans == NULL) {
            roaring_free(x);
            ROARING_TERMINATE("failed memory alloc in fastunion");
        }
        Roaring ans(c_ans);
        roaring_free(x);
        return ans;
    }